

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_FraigMiterProve(Ivy_FraigMan_t *p)

{
  Ivy_Man_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  void **ppvVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  Ivy_Obj_t *pIVar7;
  sat_solver *psVar8;
  double *pdVar9;
  int *piVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  size_t __size;
  Ivy_Obj_t *pNew;
  long lVar15;
  timespec ts;
  timespec local_60;
  uint local_50;
  lit local_4c;
  int *local_48;
  int *local_40;
  int *local_38;
  
  clock_gettime(3,&local_60);
  pVVar6 = p->pManAig->vPos;
  if (0 < pVVar6->nSize) {
    local_48 = &p->nSatCallsSat;
    local_40 = &p->nSatProof;
    local_38 = &p->nSatFailsReal;
    lVar15 = 0;
    do {
      pvVar11 = pVVar6->pArray[lVar15];
      if (((ulong)pvVar11 & 1) != 0) {
        __assert_fail("!Ivy_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                      ,0x113,"Ivy_Obj_t *Ivy_ObjChild0Equiv(Ivy_Obj_t *)");
      }
      uVar12 = *(ulong *)((long)pvVar11 + 0x10) & 0xfffffffffffffffe;
      if (uVar12 == 0) {
        pIVar7 = (Ivy_Obj_t *)0x0;
      }
      else {
        pIVar7 = (Ivy_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar11 + 0x10) & 1) ^ *(ulong *)(uVar12 + 0x48));
      }
      pIVar1 = p->pManFraig;
      pIVar2 = pIVar1->pConst1;
      if (pIVar7 == pIVar2) {
LAB_007d4e7b:
        __size = (long)pIVar1->nObjs[1] << 2;
        pvVar11 = malloc(__size);
        pIVar1->pData = pvVar11;
        memset(pvVar11,0,__size);
        return;
      }
      if (pIVar7 != (Ivy_Obj_t *)((ulong)pIVar2 ^ 1)) {
        pNew = (Ivy_Obj_t *)((ulong)pIVar7 & 0xfffffffffffffffe);
        if ((((uint)pIVar7 ^ *(uint *)&pNew->field_0x8 >> 7) & 1) != 0) goto LAB_007d4e7b;
        if (pIVar2 == pNew) {
          __assert_fail("pNew != p->pManFraig->pConst1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                        ,0x8e2,"int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *, Ivy_Obj_t *)");
        }
        p->nSatCalls = p->nSatCalls + 1;
        if (p->pSat == (sat_solver *)0x0) {
          psVar8 = sat_solver_new();
          p->pSat = psVar8;
          sat_solver_setnvars(psVar8,1000);
          psVar8 = p->pSat;
          pdVar9 = (double *)calloc((long)psVar8->cap,8);
          psVar8->factors = pdVar9;
          p->nSatVars = 1;
        }
        Ivy_FraigNodeAddToSolver(p,(Ivy_Obj_t *)0x0,pNew);
        Ivy_FraigSetActivityFactors(p,(Ivy_Obj_t *)0x0,pNew);
        iVar4 = clock_gettime(3,&local_60);
        if (iVar4 < 0) {
          lVar13 = 1;
        }
        else {
          lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
          lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_60.tv_sec * -1000000;
        }
        local_50 = (*(uint *)&pNew->field_0x8 >> 7 & 1) + *(int *)&pNew->pNextFan0 * 2;
        iVar4 = sat_solver_solve(p->pSat,(lit *)&local_50,&local_4c,(long)p->pParams->nBTLimitMiter,
                                 0,p->nBTLimitGlobal,p->nInsLimitGlobal);
        iVar5 = clock_gettime(3,&local_60);
        if (iVar5 < 0) {
          lVar14 = -1;
        }
        else {
          lVar14 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        p->timeSat = p->timeSat + lVar14 + lVar13;
        if (iVar4 == 1) {
          iVar4 = clock_gettime(3,&local_60);
          if (iVar4 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          p->timeSatSat = p->timeSatSat + lVar14 + lVar13;
          iVar4 = 0;
          piVar10 = local_48;
          if (p->pPatWords != (uint *)0x0) {
            Ivy_FraigSavePattern(p);
            piVar10 = local_48;
          }
        }
        else if (iVar4 == -1) {
          iVar4 = clock_gettime(3,&local_60);
          if (iVar4 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          p->timeSatUnsat = p->timeSatUnsat + lVar14 + lVar13;
          local_50 = local_50 ^ 1;
          iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_50,&local_4c);
          if (iVar4 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                          ,0x903,"int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *, Ivy_Obj_t *)");
          }
          p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
          iVar4 = 1;
          piVar10 = local_40;
        }
        else {
          iVar4 = clock_gettime(3,&local_60);
          if (iVar4 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          p->timeSatFail = p->timeSatFail + lVar14 + lVar13;
          pNew->field_0x9 = pNew->field_0x9 | 1;
          iVar4 = -1;
          piVar10 = local_38;
        }
        *piVar10 = *piVar10 + 1;
        if (iVar4 != -1) {
          if (iVar4 != 1) {
            pIVar1 = p->pManFraig;
            pvVar11 = malloc((long)pIVar1->nObjs[1] << 2);
            lVar15 = (long)pIVar1->vPis->nSize;
            if (0 < lVar15) {
              ppvVar3 = pIVar1->vPis->pArray;
              piVar10 = p->pSat->model;
              lVar13 = 0;
              do {
                *(uint *)((long)pvVar11 + lVar13 * 4) =
                     (uint)(piVar10[*(int *)((long)ppvVar3[lVar13] + 0x28)] == 1);
                lVar13 = lVar13 + 1;
              } while (lVar15 != lVar13);
            }
            pIVar1->pData = pvVar11;
            return;
          }
          *(ulong *)((*(ulong *)((long)pvVar11 + 0x10) & 0xfffffffffffffffe) + 0x48) =
               (ulong)((uint)*(ulong *)((long)pvVar11 + 0x10) & 1) ^ (ulong)p->pManFraig->pConst1 ^
               1;
        }
      }
      lVar15 = lVar15 + 1;
      pVVar6 = p->pManAig->vPos;
    } while (lVar15 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Ivy_FraigMiterProve( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj, * pObjNew;
    int i, RetValue;
    abctime clk = Abc_Clock();
    int fVerbose = 0;
    Ivy_ManForEachPo( p->pManAig, pObj, i )
    {
        if ( i && fVerbose )
        {
            ABC_PRT( "Time", Abc_Clock() -clk );
        }
        pObjNew = Ivy_ObjChild0Equiv(pObj);
        // check if the output is constant 1
        if ( pObjNew == p->pManFraig->pConst1 )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) is constant 1.  ", i, Ivy_ManPoNum(p->pManAig) );
            // assing constant 0 model
            p->pManFraig->pData = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
            memset( p->pManFraig->pData, 0, sizeof(int) * Ivy_ManPiNum(p->pManFraig) );
            break;
        }
        // check if the output is constant 0
        if ( pObjNew == Ivy_Not(p->pManFraig->pConst1) )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) is already constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            continue;
        }
        // check if the output can be constant 0
        if ( Ivy_Regular(pObjNew)->fPhase != (unsigned)Ivy_IsComplement(pObjNew) )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) cannot be constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            // assing constant 0 model
            p->pManFraig->pData = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
            memset( p->pManFraig->pData, 0, sizeof(int) * Ivy_ManPiNum(p->pManFraig) );
            break;
        }
/*
        // check the representative of this node
        pRepr = Ivy_ObjClassNodeRepr(Ivy_ObjFanin0(pObj));
        if ( Ivy_Regular(pRepr) != p->pManAig->pConst1 )
            printf( "Representative is not constant 1.\n" );
        else
            printf( "Representative is constant 1.\n" );
*/
        // try to prove the output constant 0
        RetValue = Ivy_FraigNodeIsConst( p, Ivy_Regular(pObjNew) );
        if ( RetValue == 1 )  // proved equivalent
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) was proved constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            // set the constant miter
            Ivy_ObjFanin0(pObj)->pEquiv = Ivy_NotCond( p->pManFraig->pConst1, !Ivy_ObjFaninC0(pObj) );
            continue;
        }
        if ( RetValue == -1 ) // failed
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) has timed out at %d backtracks.  ", i, Ivy_ManPoNum(p->pManAig), p->pParams->nBTLimitMiter );
            continue;
        }
        // proved satisfiable
        if ( fVerbose )
            printf( "Output %2d (out of %2d) was proved NOT a constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
        // create the model
        p->pManFraig->pData = Ivy_FraigCreateModel(p);
        break;
    }
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() -clk );
    }
}